

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

void collect_gradient_attributes(element_t *element,gradient_attributes_t *attributes)

{
  attribute *paVar1;
  element *peVar2;
  
  if (attributes->units == (element_t *)0x0) {
    for (paVar1 = element->attributes; (paVar1 != (attribute *)0x0 && (paVar1->id != 0xf));
        paVar1 = paVar1->next) {
    }
    if (paVar1 != (attribute *)0x0) {
      attributes->units = element;
    }
  }
  if (attributes->spread == (element_t *)0x0) {
    for (paVar1 = element->attributes; (paVar1 != (attribute *)0x0 && (paVar1->id != 0x1a));
        paVar1 = paVar1->next) {
    }
    if (paVar1 != (attribute *)0x0) {
      attributes->spread = element;
    }
  }
  if (attributes->transform == (element_t *)0x0) {
    for (paVar1 = element->attributes; (paVar1 != (attribute *)0x0 && (paVar1->id != 0xe));
        paVar1 = paVar1->next) {
    }
    if (paVar1 != (attribute *)0x0) {
      attributes->transform = element;
    }
  }
  if (attributes->stops == (element_t *)0x0) {
    for (peVar2 = element->first_child; peVar2 != (element *)0x0; peVar2 = peVar2->next_sibling) {
      if (peVar2->id == 0xe) {
        attributes->stops = element;
        return;
      }
    }
  }
  return;
}

Assistant:

static void collect_gradient_attributes(const element_t* element, gradient_attributes_t* attributes)
{
    if(attributes->units == NULL && has_attribute(element, ATTR_GRADIENT_UNITS))
        attributes->units = element;
    if(attributes->spread == NULL && has_attribute(element, ATTR_SPREAD_METHOD))
        attributes->spread = element;
    if(attributes->transform == NULL && has_attribute(element, ATTR_GRADIENT_TRANSFORM))
        attributes->transform = element;
    if(attributes->stops == NULL) {
        for(const element_t* child = element->first_child; child; child = child->next_sibling) {
            if(child->id == TAG_STOP) {
                attributes->stops = element;
                break;
            }
        }
    }
}